

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

QWindowGeometrySpecification *
QWindowGeometrySpecification::fromArgument
          (QWindowGeometrySpecification *__return_storage_ptr__,QByteArray *a)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  Corner local_7c;
  int local_78;
  int local_74;
  QArrayDataPointer<char> local_58;
  bool ok;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->xOffset = -1;
  __return_storage_ptr__->yOffset = -1;
  __return_storage_ptr__->width = -1;
  __return_storage_ptr__->height = -1;
  local_7c = TopLeftCorner;
  local_78 = -1;
  iVar8 = 0;
  local_74 = local_78;
  for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
    lVar3 = (a->d).size;
    lVar6 = (long)iVar8;
    if (lVar3 <= lVar6) break;
    pcVar1 = (a->d).ptr;
    cVar7 = pcVar1[lVar6];
    if (((cVar7 == '+') || (cVar7 == 'x')) || (cVar7 == '-')) {
      lVar6 = (long)(iVar8 + 1);
    }
    else {
      iVar8 = (int)cVar7;
      cVar7 = 'x';
      if (9 < iVar8 - 0x30U) break;
    }
    if (lVar3 <= lVar6) {
      lVar3 = lVar6;
    }
    while ((lVar4 = lVar3, lVar3 != lVar6 && (lVar4 = lVar6, (int)pcVar1[lVar6] - 0x30U < 10))) {
      lVar6 = lVar6 + 1;
    }
    iVar8 = (int)lVar4;
    ok = true;
    QByteArray::mid((longlong)&local_58,(longlong)a);
    iVar2 = QByteArray::toInt((bool *)&local_58,(int)&ok);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    if ((iVar2 < 0) || (ok == false)) break;
    if ((cVar7 == '+') || (cVar7 == '-')) {
      if (local_74 < 0) {
        local_74 = iVar2;
        if (cVar7 == '-') {
          local_7c = TopRightCorner;
        }
      }
      else {
        local_78 = iVar2;
        if (cVar7 == '-') {
          local_7c = local_7c == TopRightCorner | BottomLeftCorner;
        }
      }
    }
    else if (cVar7 == 'x') {
      piVar5 = &__return_storage_ptr__->height;
      if (__return_storage_ptr__->width < 0) {
        piVar5 = &__return_storage_ptr__->width;
      }
      *piVar5 = iVar2;
    }
  }
  __return_storage_ptr__->xOffset = local_74;
  __return_storage_ptr__->corner = local_7c;
  __return_storage_ptr__->yOffset = local_78;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QWindowGeometrySpecification QWindowGeometrySpecification::fromArgument(const QByteArray &a)
{
    QWindowGeometrySpecification result = Q_WINDOW_GEOMETRY_SPECIFICATION_INITIALIZER;
    int pos = 0;
    for (int i = 0; i < 4; ++i) {
        char op;
        const int value = nextGeometryToken(a, pos, &op);
        if (value < 0)
            break;
        switch (op) {
        case 'x':
            (result.width >= 0 ? result.height : result.width) = value;
            break;
        case '+':
        case '-':
            if (result.xOffset >= 0) {
                result.yOffset = value;
                if (op == '-')
                    result.corner = result.corner == Qt::TopRightCorner ? Qt::BottomRightCorner : Qt::BottomLeftCorner;
            } else {
                result.xOffset = value;
                if (op == '-')
                    result.corner = Qt::TopRightCorner;
            }
        }
    }
    return result;
}